

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O3

void __thiscall
OpenMD::Utils::AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_>::
writeErrorBars(AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_> *this,
              ostream *stream,string *errorMessage,ErrorHandling errorHandling)

{
  double dVar1;
  size_t sVar2;
  size_t i;
  int i_1;
  long lVar3;
  double dVar4;
  Vector3d err;
  Vector<double,_3U> var;
  Vector<double,_3U> local_78;
  string *local_58;
  double local_50;
  double local_48 [3];
  
  local_78.data_[0] = 0.0;
  local_78.data_[1] = 0.0;
  local_78.data_[2] = 0.0;
  sVar2 = (this->super_Vector3dAccumulator).Count_;
  local_58 = errorMessage;
  if (errorHandling == Variance) {
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    lVar3 = 0;
    do {
      dVar1 = (this->super_Vector3dAccumulator).Avg_.data_[lVar3];
      dVar4 = (this->super_Vector3dAccumulator).Avg2_.data_[lVar3] - dVar1 * dVar1;
      dVar1 = 0.0;
      if (0.0 <= dVar4) {
        dVar1 = dVar4;
      }
      local_48[lVar3] = dVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_78.data_[2] = local_48[2];
    local_78.data_[0] = local_48[0];
    local_78.data_[1] = local_48[1];
  }
  else if (errorHandling == StdDev) {
    Accumulator<OpenMD::Vector<double,_3U>_>::getStdDev(&local_78,&this->super_Vector3dAccumulator);
  }
  else if (errorHandling == CI95) {
    Accumulator<OpenMD::Vector<double,_3U>_>::get95percentConfidenceInterval
              (&local_78,&this->super_Vector3dAccumulator);
  }
  lVar3 = 0;
  do {
    if (errorHandling == CI95 && sVar2 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
    }
    else if ((ulong)ABS(local_78.data_[lVar3]) < 0x7ff0000000000000) {
      local_50 = local_78.data_[lVar3];
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\t",1);
      if (sVar2 != 0) {
        std::ostream::_M_insert<double>(local_50);
      }
    }
    else {
      snprintf(painCave.errMsg,2000,"%s",(local_58->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

void writeErrorBars(std::ostream& stream, const std::string& errorMessage,
                        ErrorHandling errorHandling) const override {
      Vector3d err;
      std::size_t count = Vector3dAccumulator::getCount();

      switch (errorHandling) {
      case ErrorHandling::CI95:
        err = Vector3dAccumulator::get95percentConfidenceInterval();
        break;
      case ErrorHandling::StdDev:
        err = Vector3dAccumulator::getStdDev();
        break;
      case ErrorHandling::Variance:
        err = Vector3dAccumulator::getVariance();
        break;
      default:
        break;
      }

      for (int i = 0; i < Vector3dAccumulator::getAverage().size(); i++) {
        if (count == 0 && errorHandling == ErrorHandling::CI95) {
          stream << "\t";
        } else {
          if (std::isinf(err[i]) || std::isnan(err[i])) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                     errorMessage.c_str());
            painCave.isFatal = 1;
            simError();
          } else {
            if (count == 0)
              stream << "\t";
            else
              stream << "\t" << err[i];
          }
        }
      }
    }